

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O1

void __thiscall Liby::http::HttpServer::handleReadEvent(HttpServer *this,Connection *conn)

{
  int *piVar1;
  _Atomic_word *p_Var2;
  Buffer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  element_type *peVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  bool bVar8;
  int iVar9;
  char *begin;
  char *pcVar10;
  off_t oVar11;
  ulong uVar12;
  Logger *this_01;
  mapped_type *pmVar13;
  undefined1 *in_RCX;
  ulong uVar14;
  int extraout_EDX;
  int extraout_EDX_00;
  int errcode;
  uint __len;
  char *in_R8;
  ulong __val;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  fdPtr fp;
  Reply rep;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  ulong local_128;
  key_type local_118;
  Connection *local_f8;
  __weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *local_f0;
  RequestParser *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  FileDescriptor *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  undefined8 *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  code *pcStack_b0;
  undefined1 local_a0 [32];
  off_t oStack_80;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_78;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_40;
  HttpServer *local_38;
  
  peVar4 = (conn->context_).super___shared_ptr<Liby::BaseContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_38 = this;
  if (peVar4 == (element_type *)0x0) {
    __assert_fail("conn.context_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp"
                  ,0x1d,"void Liby::http::HttpServer::handleReadEvent(Connection &)");
  }
  this_00 = &conn->readBuf_;
  local_e8 = (RequestParser *)(peVar4 + 2);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(peVar4 + 3);
  local_f0 = (__weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)
             &conn->super_enable_shared_from_this<Liby::Connection>;
  local_40 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)(peVar4 + 0xb);
  local_f8 = conn;
  do {
    bVar8 = Buffer::empty(this_00);
    if (bVar8) {
      return;
    }
    iVar9 = *(int *)((long)&peVar4[0x16]._vptr_BaseContext + 4);
    begin = Buffer::data(this_00);
    pcVar10 = Buffer::data(this_00);
    oVar11 = Buffer::size(this_00);
    RequestParser::parse(local_e8,begin,pcVar10 + oVar11);
    Buffer::retrieve(this_00,(long)*(int *)((long)&peVar4[0x16]._vptr_BaseContext + 4) - (long)iVar9
                    );
    iVar9 = (int)in_R8;
    if (5 < *(int *)&peVar4[0x16]._vptr_BaseContext) {
      std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Liby::Connection,void>
                ((__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)local_a0,local_f0);
      uVar6 = local_a0._8_8_;
      uVar5 = CONCAT44(local_a0._4_4_,local_a0._0_4_);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_a0._8_8_ + 0xc) = *(_Atomic_word *)(local_a0._8_8_ + 0xc) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_a0._8_8_ + 0xc) = *(_Atomic_word *)(local_a0._8_8_ + 0xc) + 1;
        }
      }
      errcode = extraout_EDX;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
        errcode = extraout_EDX_00;
      }
      Reply::Error_abi_cxx11_((string *)local_a0,(Reply *)0x194,errcode);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(uVar6 + 0xc) = *(_Atomic_word *)(uVar6 + 0xc) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(uVar6 + 0xc) = *(_Atomic_word *)(uVar6 + 0xc) + 1;
        }
      }
      local_138._0_8_ = 0;
      local_138._8_8_ = 0;
      local_148._0_8_ = (pointer)0x0;
      local_148._8_8_ = 0;
      local_148._0_8_ = operator_new(0x10);
      *(undefined8 *)local_148._0_8_ = uVar5;
      *(undefined8 *)(local_148._0_8_ + 8) = uVar6;
      local_138._8_8_ =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:45:42)>
           ::_M_invoke;
      local_138._0_8_ =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:45:42)>
           ::_M_manager;
      Connection::send(local_f8,(int)local_a0,local_148,(size_t)in_RCX,iVar9);
      if ((code *)local_138._0_8_ != (code *)0x0) {
        (*(code *)local_138._0_8_)(local_148,local_148,3);
      }
      if ((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != local_a0 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2 = (_Atomic_word *)(uVar6 + 0xc);
        iVar9 = *p_Var2;
        *p_Var2 = *p_Var2 + -1;
        UNLOCK();
      }
      else {
        iVar9 = *(_Atomic_word *)(uVar6 + 0xc);
        *(int *)(uVar6 + 0xc) = iVar9 + -1;
      }
      if (iVar9 != 1) {
        return;
      }
      (*(*(_func_int ***)uVar6)[3])(uVar6);
      return;
    }
    if (*(int *)&peVar4[0x16]._vptr_BaseContext != 5) {
      return;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   &local_38->root_,local_e0);
    FileDescriptor::openFile
              ((FileDescriptor *)&local_d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    if ((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != local_a0 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_));
    }
    if (local_d8 == (FileDescriptor *)0x0) {
      this_01 = Logger::getLogger();
      bVar8 = false;
      in_RCX = (undefined1 *)0x38;
      in_R8 = "handleReadEvent";
      Logger::log(this_01,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    }
    else {
      uVar12 = FileDescriptor::getFileSize(local_d8);
      local_a0._24_8_ = 0;
      oStack_80 = 0;
      local_a0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_a0._16_8_ = 0;
      local_78._M_buckets = &local_78._M_single_bucket;
      local_78._M_bucket_count = 1;
      local_78._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_78._M_element_count = 0;
      local_78._M_rehash_policy._M_max_load_factor = 1.0;
      local_78._M_rehash_policy._M_next_resize = 0;
      local_78._M_single_bucket = (__node_base_ptr)0x0;
      local_a0._0_4_ = 200;
      __val = -uVar12;
      if (0 < (long)uVar12) {
        __val = uVar12;
      }
      __len = 1;
      if (9 < __val) {
        uVar14 = __val;
        uVar7 = 4;
        do {
          __len = uVar7;
          if (uVar14 < 100) {
            __len = __len - 2;
            goto LAB_001184bb;
          }
          if (uVar14 < 1000) {
            __len = __len - 1;
            goto LAB_001184bb;
          }
          if (uVar14 < 10000) goto LAB_001184bb;
          bVar8 = 99999 < uVar14;
          uVar14 = uVar14 / 10000;
          uVar7 = __len + 4;
        } while (bVar8);
        __len = __len + 1;
      }
LAB_001184bb:
      local_148._0_8_ = local_138;
      std::__cxx11::string::_M_construct
                ((ulong)local_148,(char)__len - (char)((long)uVar12 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)(local_148._0_8_ + -((long)uVar12 >> 0x3f)),__len,__val);
      paVar3 = &local_118.field_2;
      local_118._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Content-Length","");
      pmVar13 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&local_78,&local_118);
      std::__cxx11::string::operator=((string *)pmVar13,(string *)local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar3) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((undefined1 *)local_148._0_8_ != local_138) {
        operator_delete((void *)local_148._0_8_);
      }
      getMimeType((string *)local_148,local_e0);
      local_118._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Content-Type","");
      pmVar13 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&local_78,&local_118);
      std::__cxx11::string::operator=((string *)pmVar13,(string *)local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar3) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((undefined1 *)local_148._0_8_ != local_138) {
        operator_delete((void *)local_148._0_8_);
      }
      std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Liby::Connection,void>
                ((__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)local_148,local_f0);
      uVar6 = local_148._8_8_;
      uVar5 = local_148._0_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_148._8_8_ + 0xc) = *(_Atomic_word *)(local_148._8_8_ + 0xc) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_148._8_8_ + 0xc) = *(_Atomic_word *)(local_148._8_8_ + 0xc) + 1;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
      }
      Reply::toString_abi_cxx11_(&local_118,(Reply *)local_a0);
      local_148._0_8_ = local_d8;
      local_148._8_8_ = local_d0;
      if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_d0->_M_use_count = local_d0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_d0->_M_use_count = local_d0->_M_use_count + 1;
        }
      }
      local_138._0_8_ = uVar5;
      local_138._8_8_ = uVar6;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(uVar6 + 0xc) = *(_Atomic_word *)(uVar6 + 0xc) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(uVar6 + 0xc) = *(_Atomic_word *)(uVar6 + 0xc) + 1;
        }
      }
      local_c8 = (undefined8 *)0x0;
      uStack_c0 = 0;
      local_b8 = (code *)0x0;
      pcStack_b0 = (code *)0x0;
      local_128 = uVar12;
      local_c8 = (undefined8 *)operator_new(0x28);
      uVar5 = local_148._8_8_;
      *local_c8 = local_148._0_8_;
      local_c8[1] = 0;
      local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_c8[1] = uVar5;
      local_148._0_8_ = (pointer)0x0;
      local_c8[2] = local_138._0_8_;
      local_c8[3] = local_138._8_8_;
      in_RCX = local_138;
      local_138._0_8_ = 0;
      local_138._8_8_ = (long *)0x0;
      local_c8[4] = uVar12;
      pcStack_b0 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:76:39)>
                   ::_M_invoke;
      local_b8 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:76:39)>
                 ::_M_manager;
      Connection::send(local_f8,(int)&local_118,&local_c8,(size_t)in_RCX,(int)in_R8);
      if (local_b8 != (code *)0x0) {
        (*local_b8)(&local_c8,&local_c8,3);
      }
      if ((long *)local_138._8_8_ != (long *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = (int *)(local_138._8_8_ + 0xc);
          iVar9 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
        }
        else {
          iVar9 = *(int *)(local_138._8_8_ + 0xc);
          in_RCX = (undefined1 *)(ulong)(iVar9 - 1U);
          *(uint *)(local_138._8_8_ + 0xc) = iVar9 - 1U;
        }
        if (iVar9 == 1) {
          (**(code **)(*(long *)local_138._8_8_ + 0x18))();
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar3) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      local_148._0_8_ = local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"Connection","");
      pmVar13 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[](local_40,(key_type *)local_148);
      iVar9 = std::__cxx11::string::compare((char *)pmVar13);
      bVar8 = iVar9 == 0;
      if ((undefined1 *)local_148._0_8_ != local_138) {
        operator_delete((void *)local_148._0_8_);
      }
      if (iVar9 == 0) {
        RequestParser::clear(local_e8);
      }
      else {
        *(undefined1 *)&peVar4[1]._vptr_BaseContext = 0;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2 = (_Atomic_word *)(uVar6 + 0xc);
          iVar9 = *p_Var2;
          *p_Var2 = *p_Var2 + -1;
          UNLOCK();
        }
        else {
          iVar9 = *(_Atomic_word *)(uVar6 + 0xc);
          in_RCX = (undefined1 *)(ulong)(iVar9 - 1U);
          *(uint *)(uVar6 + 0xc) = iVar9 - 1U;
        }
        if (iVar9 == 1) {
          (*(*(_func_int ***)uVar6)[3])(uVar6);
        }
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_78);
      Buffer::~Buffer((Buffer *)(local_a0 + 8));
    }
    if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
    }
    if (!bVar8) {
      return;
    }
  } while( true );
}

Assistant:

void HttpServer::handleReadEvent(Connection &conn) {
    assert(conn.context_);

    HttpContext *context = static_cast<HttpContext *>(conn.context_.get());

    while (1) {
        Buffer &readBuf = conn.read();
        if (readBuf.empty())
            return;

        int savedBytes = context->requestParser.bytes_;
        context->requestParser.parse(readBuf.data(),
                                     readBuf.data() + readBuf.size());
        readBuf.retrieve(context->requestParser.bytes_ - savedBytes);

        if (context->requestParser.isError()) {
            std::weak_ptr<Connection> weak_conn(conn.shared_from_this());
            conn.send(Reply::Error(404), [weak_conn] {
                if (!weak_conn.expired()) {
                    auto conn = weak_conn.lock();
                    conn->destroy();
                }
            });
            break;
        } else if (context->requestParser.isGood()) {
            auto fp =
                FileDescriptor::openFile(root_ + context->requestParser.uri_);
            if (!fp) {
                error("fp is null");
                return;
            }

            long filesize;
            try {
                filesize = fp->getFileSize();
            } catch (const char *err) {
                error("%s", err);
                // send error response
                break;
            }

            Reply rep;
            rep.status_ = HTTP_OK;
            rep.headers_["Content-Length"] = std::to_string(filesize);
            rep.headers_["Content-Type"] =
                getMimeType(context->requestParser.uri_);

            std::weak_ptr<Connection> weak_conn(conn.shared_from_this());
            conn.send(rep.toString(), [fp, weak_conn, filesize] {
                if (!weak_conn.expired()) {
                    auto conn = weak_conn.lock();
                    conn->sendFile(fp, 0, filesize, [conn] {
                        HttpContext *context =
                            static_cast<HttpContext *>(conn->context_.get());
                        if (!context->keep_alive_)
                            conn->destroyLater();
                    });
                }
            });
            if (context->requestParser.headers_["Connection"] != "keep-alive") {
                context->keep_alive_ = false;
                break;
            }
            context->requestParser.clear();
        } else {
            break;
        }
    }
}